

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

void __thiscall QLCDNumber::display(QLCDNumber *this,QString *s)

{
  long lVar1;
  QLCDNumberPrivate *this_00;
  long in_FS_OFFSET;
  bool ok;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00->val = 0.0;
  QString::toDouble((bool *)s);
  QLCDNumberPrivate::internalSetString(this_00,s);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::display(const QString &s)
{
    Q_D(QLCDNumber);
    d->val = 0;
    bool ok = false;
    double v = s.toDouble(&ok);
    if (ok)
        d->val = v;
    d->internalSetString(s);
}